

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_call(CTcPrsNode *lhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  CTPNArglist *arglist;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  CTcPrsNode *pCVar8;
  CTPNCall *this;
  undefined4 extraout_var_07;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar9;
  undefined4 uVar10;
  CTPNArg *pCVar11;
  undefined8 local_4c;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  CTcPrsNodeBase CStack_38;
  long *plVar7;
  
  arglist = parse_arg_list();
  if (arglist == (CTPNArglist *)0x0) {
    return (CTcPrsNode *)0x0;
  }
  if (lhs == (CTcPrsNode *)0x0) goto LAB_001fbe69;
  iVar2 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(lhs,"defined",7);
  if (iVar2 != 0) {
    if ((arglist->super_CTPNArglistBase).argc_ == 1) {
      pCVar8 = (((arglist->super_CTPNArglistBase).list_)->super_CTPNArgBase).arg_expr_;
      iVar2 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar8);
      if (CONCAT44(extraout_var,iVar2) != 0) {
        pCVar9 = G_prs->global_symtab_;
        iVar2 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar8);
        iVar3 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar8);
        do {
          iVar4 = (*pCVar9->_vptr_CTcPrsSymtab[2])
                            (pCVar9,CONCAT44(extraout_var_00,iVar2),CONCAT44(extraout_var_01,iVar3))
          ;
          plVar7 = (long *)CONCAT44(extraout_var_02,iVar4);
          if (plVar7 != (long *)0x0) {
            (**(code **)(*plVar7 + 0x78))(plVar7);
            uVar10 = 2;
            if (*(int *)((long)plVar7 + 0x24) != 0) goto LAB_001fbe1d;
            break;
          }
          pCVar9 = pCVar9->parent_;
        } while (pCVar9 != (CTcPrsSymtab *)0x0);
        uVar10 = 1;
LAB_001fbe1d:
        pCVar8 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
        *(undefined4 *)&pCVar8[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = uVar10;
        *(undefined8 *)((long)&pCVar8[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) = local_4c;
        *(ulong *)((long)&pCVar8[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) =
             CONCAT44(uStack_40,uStack_44);
        pCVar8[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
             (_func_int **)CONCAT44(uStack_3c,uStack_40);
        pCVar8[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = CStack_38._vptr_CTcPrsNodeBase;
        *(undefined1 *)&pCVar8[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
        (pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00314838;
        return pCVar8;
      }
    }
    CTcTokenizer::log_error(0x2be1);
  }
  iVar2 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(lhs,"__objref",8);
  if (iVar2 == 0) goto LAB_001fbe69;
  iVar2 = (arglist->super_CTPNArglistBase).argc_;
  if (2 < iVar2) {
LAB_001fbd35:
    CTcTokenizer::log_error(0x2be2);
    return lhs;
  }
  pCVar11 = (arglist->super_CTPNArglistBase).list_;
  if (iVar2 == 2) {
    pCVar8 = (pCVar11->super_CTPNArgBase).arg_expr_;
    pCVar11 = (pCVar11->super_CTPNArgBase).next_arg_;
    iVar3 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(pCVar8,"warn",4);
    bVar1 = true;
    if (iVar3 == 0) {
      iVar3 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(pCVar8,"error",5);
      if (iVar3 == 0) goto LAB_001fbd35;
      goto LAB_001fbd8e;
    }
  }
  else {
LAB_001fbd8e:
    bVar1 = false;
  }
  pCVar8 = (pCVar11->super_CTPNArgBase).arg_expr_;
  iVar3 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar8);
  if (CONCAT44(extraout_var_03,iVar3) != 0) {
    pCVar9 = G_prs->global_symtab_;
    iVar3 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar8);
    iVar4 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar8);
    do {
      iVar5 = (*pCVar9->_vptr_CTcPrsSymtab[2])
                        (pCVar9,CONCAT44(extraout_var_04,iVar3),CONCAT44(extraout_var_05,iVar4));
      plVar7 = (long *)CONCAT44(extraout_var_06,iVar5);
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 0x78))(plVar7);
        if (*(int *)((long)plVar7 + 0x24) == 2) {
          return pCVar8;
        }
        break;
      }
      pCVar9 = pCVar9->parent_;
    } while (pCVar9 != (CTcPrsSymtab *)0x0);
    if ((iVar2 == 2) && ((G_prs->field_0xec & 4) == 0)) {
      iVar2 = 0x2d00;
      if (plVar7 == (long *)0x0) {
        iVar2 = 0x2b18;
      }
      uVar6 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar8);
      iVar3 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar8);
      if (bVar1) {
        CTcTokenizer::log_warning(iVar2,(ulong)uVar6,CONCAT44(extraout_var_07,iVar3));
      }
      else {
        CTcTokenizer::log_error(iVar2,(ulong)uVar6,CONCAT44(extraout_var_07,iVar3));
      }
    }
    pCVar8 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
    *(undefined4 *)&pCVar8[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
    *(undefined8 *)((long)&pCVar8[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) = local_4c;
    *(ulong *)((long)&pCVar8[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 4) =
         CONCAT44(uStack_40,uStack_44);
    pCVar8[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)CONCAT44(uStack_3c,uStack_40);
    pCVar8[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = CStack_38._vptr_CTcPrsNodeBase;
    *(undefined1 *)&pCVar8[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
    (pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00314838;
    return pCVar8;
  }
  CTcTokenizer::log_error(0x2be2);
LAB_001fbe69:
  this = (CTPNCall *)CTcPrsMem::alloc(G_prsmem,0x18);
  CTPNCall::CTPNCall(this,lhs,arglist);
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_call(CTcPrsNode *lhs)
{
    /* parse the argument list */
    CTPNArglist *arglist = parse_arg_list();
    if (arglist == 0)
        return 0;

    /* check for the special "defined()" syntax */
    if (lhs != 0 && lhs->sym_text_matches("defined", 7))
    {
        /* make sure we have one argument that's a symbol */
        CTcPrsNode *arg;
        if (arglist->get_argc() == 1
            && (arg = arglist->get_arg_list_head()->get_arg_expr())
                ->get_sym_text() != 0)
        {
            /* look up the symbol */
            CTcSymbol *sym = G_prs->get_global_symtab()->find(
                arg->get_sym_text(), arg->get_sym_text_len());

            /* 
             *   The result is a constant 'true' or 'nil' node, depending on
             *   whether the symbol is defined.  Note that this is a "compile
             *   time constant" expression, not a true constant - flag it as
             *   such so that we don't generate a warning if this value is
             *   used as the conditional expression of an if, while, or for.
             */
            CTcConstVal cval;
            cval.set_bool(sym != 0 && sym->get_type() != TC_SYM_UNKNOWN);
            cval.set_ctc(TRUE);
            return new CTPNConst(&cval);
        }
        else
        {
            /* invalid syntax */
            G_tok->log_error(TCERR_DEFINED_SYNTAX);
        }
    }

    /* check for the special "__objref" syntax */
    if (lhs != 0 && lhs->sym_text_matches("__objref", 8))
    {
        /* assume we won't generate an error or warning if it's undefined */
        int errhandling = 0;

        /* get the rightmost argument */
        CTPNArg *curarg = arglist->get_arg_list_head();

        /* if we have other than two arguments, it's an error */
        if (arglist->get_argc() > 2)
        {
            G_tok->log_error(TCERR___OBJREF_SYNTAX);
            return lhs;
        }

        /* if we have two arguments, get the warning/error mode */
        if (arglist->get_argc() == 2)
        {
            /* get the argument, and skip to the next to the left */
            CTcPrsNode *arg = curarg->get_arg_expr();
            curarg = curarg->get_next_arg();

            /* it has to be "warn" or "error" */
            if (arg->sym_text_matches("warn", 4))
            {
                errhandling = 1;
            }
            else if (arg->sym_text_matches("error", 5))
            {
                errhandling = 2;
            }
            else
            {
                G_tok->log_error(TCERR___OBJREF_SYNTAX);
                return lhs;
            }
        }

        /* the first argument must be a symbol */
        CTcPrsNode *arg = curarg->get_arg_expr();
        if (arg->get_sym_text() != 0)
        {
            /* look up the symbol */
            CTcSymbol *sym = G_prs->get_global_symtab()->find(
                arg->get_sym_text(), arg->get_sym_text_len());
            
            /* 
             *   The result is the object reference value if the symbol is
             *   defined as an object, or nil if it's undefined or something
             *   other than an object.
             */
            CTcConstVal cval;
            if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
            {
                /* it's an object - the result is the object symbol */
                return arg;
            }
            else
            {
                /* log a warning or error, if applicable */
                if (errhandling != 0 && !G_prs->get_syntax_only())
                {
                    /* note whether it's undefined or otherwise defined */
                    int errcode =
                        (sym == 0 ? TCERR_UNDEF_SYM : TCERR_SYM_NOT_OBJ);

                    /* log an error or warning, as desired */
                    if (errhandling == 1)
                        G_tok->log_warning(
                            errcode, (int)arg->get_sym_text_len(),
                            arg->get_sym_text());
                    else
                        G_tok->log_error(
                            errcode, (int)arg->get_sym_text_len(),
                            arg->get_sym_text());
                }
                
                /* not defined or non-object - the result is nil */
                cval.set_bool(FALSE);
                cval.set_ctc(TRUE);
                return new CTPNConst(&cval);
            }
        }
        else
        {
            /* invalid syntax */
            G_tok->log_error(TCERR___OBJREF_SYNTAX);
        }
    }

    /* build and return the function call node */
    return new CTPNCall(lhs, arglist);
}